

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O0

bool __thiscall
Diligent::ThreadPoolImpl::ProcessTask(ThreadPoolImpl *this,Uint32 ThreadId,bool WaitForTask)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  pointer ppVar4;
  float *pfVar5;
  IAsyncTask *pIVar6;
  Char *Message;
  atomic<int> *paVar7;
  float extraout_XMM0_Da;
  float local_130;
  int local_12c;
  undefined1 local_128 [4];
  int NumRunningTasks;
  unique_lock<std::mutex> lock_1;
  string msg;
  byte local_ed;
  ASYNC_TASK_STATUS ReturnStatus;
  undefined1 local_e8 [3];
  bool TaskFinished;
  RefCntAutoPtr<Diligent::IAsyncTask> pPrereqTask;
  RefCntWeakPtr<Diligent::IAsyncTask> *pPrereq;
  iterator __end3;
  iterator __begin3;
  vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
  *__range3;
  float MinPrereqPriority;
  bool PrerequisitesMet;
  _Base_ptr local_b0;
  _Rb_tree_iterator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_> local_a8;
  iterator front;
  undefined1 local_80 [8];
  unique_lock<std::mutex> lock;
  QueuedTaskInfo TaskInfo;
  bool WaitForTask_local;
  Uint32 ThreadId_local;
  ThreadPoolImpl *this_local;
  
  TaskInfo.Prerequisites.
  super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = WaitForTask;
  TaskInfo.Prerequisites.
  super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = ThreadId;
  QueuedTaskInfo::QueuedTaskInfo((QueuedTaskInfo *)&lock._M_owns);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_80,&this->m_TasksQueueMtx);
  if ((TaskInfo.Prerequisites.
       super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
    std::condition_variable::
    wait<Diligent::ThreadPoolImpl::ProcessTask(unsigned_int,bool)::_lambda()_1_>
              (&this->m_NextTaskCond,(unique_lock<std::mutex> *)local_80,
               (anon_class_8_1_8991fb9c)this);
  }
  bVar1 = std::atomic<bool>::load(&this->m_Stop,memory_order_seq_cst);
  if ((bVar1) &&
     (bVar1 = std::
              multimap<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo,_std::greater<float>,_std::allocator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
              ::empty(&this->m_TasksQueue), bVar1)) {
    this_local._7_1_ = 0;
    front._M_node._4_4_ = 1;
  }
  else {
    bVar1 = std::
            multimap<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo,_std::greater<float>,_std::allocator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
            ::empty(&this->m_TasksQueue);
    if (!bVar1) {
      local_a8._M_node =
           (_Base_ptr)
           std::
           multimap<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo,_std::greater<float>,_std::allocator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
           ::begin(&this->m_TasksQueue);
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>
               ::operator->(&local_a8);
      QueuedTaskInfo::operator=((QueuedTaskInfo *)&lock._M_owns,&ppVar4->second);
      LOCK();
      (this->m_NumRunningTasks).super___atomic_base<int>._M_i =
           (this->m_NumRunningTasks).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_b0 = local_a8._M_node;
      _MinPrereqPriority =
           std::
           multimap<float,Diligent::ThreadPoolImpl::QueuedTaskInfo,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
           ::erase_abi_cxx11_((multimap<float,Diligent::ThreadPoolImpl::QueuedTaskInfo,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
                               *)&this->m_TasksQueue,local_a8._M_node);
    }
    front._M_node._4_4_ = 0;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_80);
  if (front._M_node._4_4_ == 0) {
    bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)&lock._M_owns);
    if (bVar1) {
      __range3._7_1_ = 1;
      __range3._0_4_ = 3.4028235e+38;
      __end3 = std::
               vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
               ::begin((vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
                        *)&TaskInfo);
      pPrereq = (RefCntWeakPtr<Diligent::IAsyncTask> *)
                std::
                vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
                ::end((vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
                       *)&TaskInfo);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_*,_std::vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>_>
                                         *)&pPrereq), bVar1) {
        pPrereqTask.m_pObject =
             (IAsyncTask *)
             __gnu_cxx::
             __normal_iterator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_*,_std::vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>_>
             ::operator*(&__end3);
        RefCntWeakPtr<Diligent::IAsyncTask>::Lock((RefCntWeakPtr<Diligent::IAsyncTask> *)local_e8);
        bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)local_e8);
        if (bVar1) {
          pIVar6 = RefCntAutoPtr<Diligent::IAsyncTask>::operator->
                             ((RefCntAutoPtr<Diligent::IAsyncTask> *)local_e8);
          uVar2 = (*(pIVar6->super_IObject)._vptr_IObject[10])();
          if ((uVar2 & 1) == 0) {
            __range3._7_1_ = 0;
            pIVar6 = RefCntAutoPtr<Diligent::IAsyncTask>::operator->
                               ((RefCntAutoPtr<Diligent::IAsyncTask> *)local_e8);
            (*(pIVar6->super_IObject)._vptr_IObject[9])();
            pfVar5 = std::min<float>((float *)&__range3,(float *)&ReturnStatus);
            __range3._0_4_ = *pfVar5;
          }
        }
        RefCntAutoPtr<Diligent::IAsyncTask>::~RefCntAutoPtr
                  ((RefCntAutoPtr<Diligent::IAsyncTask> *)local_e8);
        __gnu_cxx::
        __normal_iterator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_*,_std::vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>_>
        ::operator++(&__end3);
      }
      local_ed = 0;
      if ((__range3._7_1_ & 1) != 0) {
        pIVar6 = RefCntAutoPtr<Diligent::IAsyncTask>::operator->
                           ((RefCntAutoPtr<Diligent::IAsyncTask> *)&lock._M_owns);
        (*(pIVar6->super_IObject)._vptr_IObject[6])(pIVar6,2);
        pIVar6 = RefCntAutoPtr<Diligent::IAsyncTask>::operator->
                           ((RefCntAutoPtr<Diligent::IAsyncTask> *)&lock._M_owns);
        uVar2 = (*(pIVar6->super_IObject)._vptr_IObject[4])
                          (pIVar6,(ulong)TaskInfo.Prerequisites.
                                         super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        pIVar6 = RefCntAutoPtr<Diligent::IAsyncTask>::operator->
                           ((RefCntAutoPtr<Diligent::IAsyncTask> *)&lock._M_owns);
        (*(pIVar6->super_IObject)._vptr_IObject[6])(pIVar6,(ulong)uVar2);
        pIVar6 = RefCntAutoPtr<Diligent::IAsyncTask>::operator->
                           ((RefCntAutoPtr<Diligent::IAsyncTask> *)&lock._M_owns);
        uVar2 = (*(pIVar6->super_IObject)._vptr_IObject[10])();
        local_ed = (byte)uVar2 & 1;
        if ((uVar2 & 1) == 0) {
          pIVar6 = RefCntAutoPtr<Diligent::IAsyncTask>::operator->
                             ((RefCntAutoPtr<Diligent::IAsyncTask> *)&lock._M_owns);
          iVar3 = (*(pIVar6->super_IObject)._vptr_IObject[7])();
          if (iVar3 != 1) {
            FormatString<char[67]>
                      ((string *)&lock_1._M_owns,
                       (char (*) [67])
                       "Finished tasks must be in COMPLETE, CANCELLED or NOT_STARTED state");
            Message = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (Message,"ProcessTask",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/ThreadPool.cpp"
                       ,0x8d);
            std::__cxx11::string::~string((string *)&lock_1._M_owns);
          }
        }
      }
      std::unique_lock<std::mutex>::unique_lock
                ((unique_lock<std::mutex> *)local_128,&this->m_TasksQueueMtx);
      paVar7 = &this->m_NumRunningTasks;
      LOCK();
      local_12c = (paVar7->super___atomic_base<int>)._M_i;
      (paVar7->super___atomic_base<int>)._M_i = (paVar7->super___atomic_base<int>)._M_i + -1;
      UNLOCK();
      local_12c = local_12c + -1;
      if (local_ed == 0) {
        pIVar6 = RefCntAutoPtr<Diligent::IAsyncTask>::operator->
                           ((RefCntAutoPtr<Diligent::IAsyncTask> *)&lock._M_owns);
        (*(pIVar6->super_IObject)._vptr_IObject[9])();
        if (__range3._0_4_ < extraout_XMM0_Da) {
          pIVar6 = RefCntAutoPtr<Diligent::IAsyncTask>::operator->
                             ((RefCntAutoPtr<Diligent::IAsyncTask> *)&lock._M_owns);
          (*(pIVar6->super_IObject)._vptr_IObject[8])(__range3._0_4_);
        }
        pIVar6 = RefCntAutoPtr<Diligent::IAsyncTask>::operator->
                           ((RefCntAutoPtr<Diligent::IAsyncTask> *)&lock._M_owns);
        (*(pIVar6->super_IObject)._vptr_IObject[9])();
        std::
        multimap<float,Diligent::ThreadPoolImpl::QueuedTaskInfo,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
        ::emplace<float,Diligent::ThreadPoolImpl::QueuedTaskInfo>
                  ((multimap<float,Diligent::ThreadPoolImpl::QueuedTaskInfo,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
                    *)&this->m_TasksQueue,&local_130,(QueuedTaskInfo *)&lock._M_owns);
      }
      else {
        bVar1 = std::
                multimap<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo,_std::greater<float>,_std::allocator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
                ::empty(&this->m_TasksQueue);
        if ((bVar1) && (local_12c == 0)) {
          std::condition_variable::notify_one();
        }
      }
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_128);
      if (local_ed == 0) {
        std::condition_variable::notify_one();
      }
    }
    this_local._7_1_ = 1;
    front._M_node._4_4_ = 1;
  }
  QueuedTaskInfo::~QueuedTaskInfo((QueuedTaskInfo *)&lock._M_owns);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

ProcessTask(Uint32 ThreadId, bool WaitForTask) override final
    {
        QueuedTaskInfo TaskInfo;
        {
            std::unique_lock<std::mutex> lock{m_TasksQueueMtx};
            if (WaitForTask)
            {
                // The effects of notify_one()/notify_all() and each of the three atomic parts of
                // wait()/wait_for()/wait_until() (unlock+wait, wakeup, and lock) take place in a
                // single total order that can be viewed as modification order of an atomic variable:
                // the order is specific to this individual condition variable. This makes it impossible
                // for notify_one() to, for example, be delayed and unblock a thread that started waiting
                // just after the call to notify_one() was made.
                m_NextTaskCond.wait(lock,
                                    [this] //
                                    {
                                        return m_Stop.load() || !m_TasksQueue.empty();
                                    } //
                );
            }

            // m_Stop must be accessed under the mutex
            if (m_Stop.load() && m_TasksQueue.empty())
                return false;

            if (!m_TasksQueue.empty())
            {
                auto front = m_TasksQueue.begin();
                TaskInfo   = std::move(front->second);
                // NB: we must increment the running task counter while holding the lock and
                //     before removing the task from the queue, otherwise WaitForAllTasks() may
                //     miss the task.
                m_NumRunningTasks.fetch_add(1);
                m_TasksQueue.erase(front);
            }
        }

        if (TaskInfo.pTask)
        {
            // Check prerequisites
            bool  PrerequisitesMet  = true;
            float MinPrereqPriority = +FLT_MAX;
            for (auto& pPrereq : TaskInfo.Prerequisites)
            {
                if (auto pPrereqTask = pPrereq.Lock())
                {
                    if (!pPrereqTask->IsFinished())
                    {
                        PrerequisitesMet  = false;
                        MinPrereqPriority = std::min(MinPrereqPriority, pPrereqTask->GetPriority());
                    }
                }
            }

            bool TaskFinished = false;
            if (PrerequisitesMet)
            {
                TaskInfo.pTask->SetStatus(ASYNC_TASK_STATUS_RUNNING);
                ASYNC_TASK_STATUS ReturnStatus = TaskInfo.pTask->Run(ThreadId);
                // NB: It is essential to set the task status after the Run() method returns.
                //     This way if the GetStatus() method returns any value other than ASYNC_TASK_STATUS_RUNNING,
                //     it is guaranteed that the task is not executed by any thread.
                TaskInfo.pTask->SetStatus(ReturnStatus);
                TaskFinished = TaskInfo.pTask->IsFinished();
                DEV_CHECK_ERR((TaskFinished || TaskInfo.pTask->GetStatus() == ASYNC_TASK_STATUS_NOT_STARTED),
                              "Finished tasks must be in COMPLETE, CANCELLED or NOT_STARTED state");
            }

            {
                std::unique_lock<std::mutex> lock{m_TasksQueueMtx};

                const auto NumRunningTasks = m_NumRunningTasks.fetch_add(-1) - 1;

                if (TaskFinished)
                {
                    if (m_TasksQueue.empty() && NumRunningTasks == 0)
                    {
                        m_TasksFinishedCond.notify_one();
                    }
                }
                else
                {
                    // If prerequisites are not met or the task requested to be re-run,
                    // re-enqueue the task with the minimum prerequisite priority
                    if (TaskInfo.pTask->GetPriority() > MinPrereqPriority)
                        TaskInfo.pTask->SetPriority(MinPrereqPriority);
                    m_TasksQueue.emplace(TaskInfo.pTask->GetPriority(), std::move(TaskInfo));
                }
            }

            if (!TaskFinished)
            {
                m_NextTaskCond.notify_one();
            }
        }

        return true;
    }